

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void transpose16x32_avx2(__m256i *x,__m256i *d)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i w15;
  __m256i w14;
  __m256i w13;
  __m256i w12;
  __m256i w11;
  __m256i w10;
  __m256i w9;
  __m256i w8;
  __m256i w7;
  __m256i w6;
  __m256i w5;
  __m256i w4;
  __m256i w3;
  __m256i w2;
  __m256i w1;
  __m256i w0;
  
  auVar1 = vpunpcklbw_avx2(*in_RDI,in_RDI[1]);
  auVar2 = vpunpcklbw_avx2(in_RDI[2],in_RDI[3]);
  auVar3 = vpunpcklbw_avx2(in_RDI[4],in_RDI[5]);
  auVar4 = vpunpcklbw_avx2(in_RDI[6],in_RDI[7]);
  auVar5 = vpunpcklbw_avx2(in_RDI[8],in_RDI[9]);
  auVar6 = vpunpcklbw_avx2(in_RDI[10],in_RDI[0xb]);
  auVar7 = vpunpcklbw_avx2(in_RDI[0xc],in_RDI[0xd]);
  auVar8 = vpunpcklbw_avx2(in_RDI[0xe],in_RDI[0xf]);
  auVar9 = vpunpcklwd_avx2(auVar1,auVar2);
  auVar10 = vpunpcklwd_avx2(auVar3,auVar4);
  auVar11 = vpunpcklwd_avx2(auVar5,auVar6);
  auVar12 = vpunpcklwd_avx2(auVar7,auVar8);
  auVar13 = vpunpckldq_avx2(auVar9,auVar10);
  auVar9 = vpunpckhdq_avx2(auVar9,auVar10);
  auVar14 = vpunpckldq_avx2(auVar11,auVar12);
  auVar10 = vpunpckhdq_avx2(auVar11,auVar12);
  auVar11 = vpunpcklqdq_avx2(auVar13,auVar14);
  *in_RSI = auVar11;
  auVar11 = vpunpckhqdq_avx2(auVar13,auVar14);
  in_RSI[1] = auVar11;
  auVar11 = vpunpcklqdq_avx2(auVar9,auVar10);
  in_RSI[2] = auVar11;
  auVar9 = vpunpckhqdq_avx2(auVar9,auVar10);
  in_RSI[3] = auVar9;
  auVar9 = vpunpckhwd_avx2(auVar1,auVar2);
  auVar10 = vpunpckhwd_avx2(auVar3,auVar4);
  auVar11 = vpunpckhwd_avx2(auVar5,auVar6);
  auVar1 = vpunpckhwd_avx2(auVar7,auVar8);
  auVar2 = vpunpckldq_avx2(auVar9,auVar10);
  auVar9 = vpunpckhdq_avx2(auVar9,auVar10);
  auVar3 = vpunpckldq_avx2(auVar11,auVar1);
  auVar10 = vpunpckhdq_avx2(auVar11,auVar1);
  auVar11 = vpunpcklqdq_avx2(auVar2,auVar3);
  in_RSI[4] = auVar11;
  auVar11 = vpunpckhqdq_avx2(auVar2,auVar3);
  in_RSI[5] = auVar11;
  auVar11 = vpunpcklqdq_avx2(auVar9,auVar10);
  in_RSI[6] = auVar11;
  auVar9 = vpunpckhqdq_avx2(auVar9,auVar10);
  in_RSI[7] = auVar9;
  auVar9 = vpunpckhbw_avx2(*in_RDI,in_RDI[1]);
  auVar10 = vpunpckhbw_avx2(in_RDI[2],in_RDI[3]);
  auVar11 = vpunpckhbw_avx2(in_RDI[4],in_RDI[5]);
  auVar1 = vpunpckhbw_avx2(in_RDI[6],in_RDI[7]);
  auVar2 = vpunpckhbw_avx2(in_RDI[8],in_RDI[9]);
  auVar3 = vpunpckhbw_avx2(in_RDI[10],in_RDI[0xb]);
  auVar4 = vpunpckhbw_avx2(in_RDI[0xc],in_RDI[0xd]);
  auVar5 = vpunpckhbw_avx2(in_RDI[0xe],in_RDI[0xf]);
  auVar6 = vpunpcklwd_avx2(auVar9,auVar10);
  auVar7 = vpunpcklwd_avx2(auVar11,auVar1);
  auVar8 = vpunpcklwd_avx2(auVar2,auVar3);
  auVar12 = vpunpcklwd_avx2(auVar4,auVar5);
  auVar13 = vpunpckldq_avx2(auVar6,auVar7);
  auVar6 = vpunpckhdq_avx2(auVar6,auVar7);
  auVar14 = vpunpckldq_avx2(auVar8,auVar12);
  auVar7 = vpunpckhdq_avx2(auVar8,auVar12);
  auVar8 = vpunpcklqdq_avx2(auVar13,auVar14);
  in_RSI[8] = auVar8;
  auVar8 = vpunpckhqdq_avx2(auVar13,auVar14);
  in_RSI[9] = auVar8;
  auVar8 = vpunpcklqdq_avx2(auVar6,auVar7);
  in_RSI[10] = auVar8;
  auVar6 = vpunpckhqdq_avx2(auVar6,auVar7);
  in_RSI[0xb] = auVar6;
  auVar9 = vpunpckhwd_avx2(auVar9,auVar10);
  auVar10 = vpunpckhwd_avx2(auVar11,auVar1);
  auVar11 = vpunpckhwd_avx2(auVar2,auVar3);
  auVar1 = vpunpckhwd_avx2(auVar4,auVar5);
  auVar2 = vpunpckldq_avx2(auVar9,auVar10);
  auVar9 = vpunpckhdq_avx2(auVar9,auVar10);
  auVar3 = vpunpckldq_avx2(auVar11,auVar1);
  auVar10 = vpunpckhdq_avx2(auVar11,auVar1);
  auVar11 = vpunpcklqdq_avx2(auVar2,auVar3);
  in_RSI[0xc] = auVar11;
  auVar11 = vpunpckhqdq_avx2(auVar2,auVar3);
  in_RSI[0xd] = auVar11;
  auVar11 = vpunpcklqdq_avx2(auVar9,auVar10);
  in_RSI[0xe] = auVar11;
  auVar9 = vpunpckhqdq_avx2(auVar9,auVar10);
  in_RSI[0xf] = auVar9;
  return;
}

Assistant:

static inline void transpose16x32_avx2(__m256i *x, __m256i *d) {
  __m256i w0, w1, w2, w3, w4, w5, w6, w7, w8, w9;
  __m256i w10, w11, w12, w13, w14, w15;

  w0 = _mm256_unpacklo_epi8(x[0], x[1]);
  w1 = _mm256_unpacklo_epi8(x[2], x[3]);
  w2 = _mm256_unpacklo_epi8(x[4], x[5]);
  w3 = _mm256_unpacklo_epi8(x[6], x[7]);

  w8 = _mm256_unpacklo_epi8(x[8], x[9]);
  w9 = _mm256_unpacklo_epi8(x[10], x[11]);
  w10 = _mm256_unpacklo_epi8(x[12], x[13]);
  w11 = _mm256_unpacklo_epi8(x[14], x[15]);

  w4 = _mm256_unpacklo_epi16(w0, w1);
  w5 = _mm256_unpacklo_epi16(w2, w3);
  w12 = _mm256_unpacklo_epi16(w8, w9);
  w13 = _mm256_unpacklo_epi16(w10, w11);

  w6 = _mm256_unpacklo_epi32(w4, w5);
  w7 = _mm256_unpackhi_epi32(w4, w5);
  w14 = _mm256_unpacklo_epi32(w12, w13);
  w15 = _mm256_unpackhi_epi32(w12, w13);

  // Store first 4-line result
  d[0] = _mm256_unpacklo_epi64(w6, w14);
  d[1] = _mm256_unpackhi_epi64(w6, w14);
  d[2] = _mm256_unpacklo_epi64(w7, w15);
  d[3] = _mm256_unpackhi_epi64(w7, w15);

  w4 = _mm256_unpackhi_epi16(w0, w1);
  w5 = _mm256_unpackhi_epi16(w2, w3);
  w12 = _mm256_unpackhi_epi16(w8, w9);
  w13 = _mm256_unpackhi_epi16(w10, w11);

  w6 = _mm256_unpacklo_epi32(w4, w5);
  w7 = _mm256_unpackhi_epi32(w4, w5);
  w14 = _mm256_unpacklo_epi32(w12, w13);
  w15 = _mm256_unpackhi_epi32(w12, w13);

  // Store second 4-line result
  d[4] = _mm256_unpacklo_epi64(w6, w14);
  d[5] = _mm256_unpackhi_epi64(w6, w14);
  d[6] = _mm256_unpacklo_epi64(w7, w15);
  d[7] = _mm256_unpackhi_epi64(w7, w15);

  // upper half
  w0 = _mm256_unpackhi_epi8(x[0], x[1]);
  w1 = _mm256_unpackhi_epi8(x[2], x[3]);
  w2 = _mm256_unpackhi_epi8(x[4], x[5]);
  w3 = _mm256_unpackhi_epi8(x[6], x[7]);

  w8 = _mm256_unpackhi_epi8(x[8], x[9]);
  w9 = _mm256_unpackhi_epi8(x[10], x[11]);
  w10 = _mm256_unpackhi_epi8(x[12], x[13]);
  w11 = _mm256_unpackhi_epi8(x[14], x[15]);

  w4 = _mm256_unpacklo_epi16(w0, w1);
  w5 = _mm256_unpacklo_epi16(w2, w3);
  w12 = _mm256_unpacklo_epi16(w8, w9);
  w13 = _mm256_unpacklo_epi16(w10, w11);

  w6 = _mm256_unpacklo_epi32(w4, w5);
  w7 = _mm256_unpackhi_epi32(w4, w5);
  w14 = _mm256_unpacklo_epi32(w12, w13);
  w15 = _mm256_unpackhi_epi32(w12, w13);

  // Store first 4-line result
  d[8] = _mm256_unpacklo_epi64(w6, w14);
  d[9] = _mm256_unpackhi_epi64(w6, w14);
  d[10] = _mm256_unpacklo_epi64(w7, w15);
  d[11] = _mm256_unpackhi_epi64(w7, w15);

  w4 = _mm256_unpackhi_epi16(w0, w1);
  w5 = _mm256_unpackhi_epi16(w2, w3);
  w12 = _mm256_unpackhi_epi16(w8, w9);
  w13 = _mm256_unpackhi_epi16(w10, w11);

  w6 = _mm256_unpacklo_epi32(w4, w5);
  w7 = _mm256_unpackhi_epi32(w4, w5);
  w14 = _mm256_unpacklo_epi32(w12, w13);
  w15 = _mm256_unpackhi_epi32(w12, w13);

  // Store second 4-line result
  d[12] = _mm256_unpacklo_epi64(w6, w14);
  d[13] = _mm256_unpackhi_epi64(w6, w14);
  d[14] = _mm256_unpacklo_epi64(w7, w15);
  d[15] = _mm256_unpackhi_epi64(w7, w15);
}